

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# def_use_manager.cpp
# Opt level: O0

void __thiscall
spvtools::opt::analysis::DefUseManager::ClearInst(DefUseManager *this,Instruction *inst)

{
  bool bVar1;
  uint32_t uVar2;
  const_iterator __first;
  uint32_t local_5c;
  _Base_ptr local_58;
  _Base_ptr local_50;
  _Base_ptr local_48;
  const_iterator local_40;
  const_iterator new_end;
  iterator end;
  const_iterator users_begin;
  _Node_iterator_base<std::pair<const_spvtools::opt::Instruction_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_false>
  local_20;
  iterator iter;
  Instruction *inst_local;
  DefUseManager *this_local;
  
  iter.
  super__Node_iterator_base<std::pair<const_spvtools::opt::Instruction_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_false>
  ._M_cur = (_Node_iterator_base<std::pair<const_spvtools::opt::Instruction_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_false>
             )(_Node_iterator_base<std::pair<const_spvtools::opt::Instruction_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_false>
               )inst;
  local_20._M_cur =
       (__node_type *)
       std::
       unordered_map<const_spvtools::opt::Instruction_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<const_spvtools::opt::Instruction_*>,_std::equal_to<const_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_spvtools::opt::Instruction_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
       ::find(&this->inst_to_used_ids_,(key_type *)&iter);
  users_begin._M_node =
       (_Base_ptr)
       std::
       unordered_map<const_spvtools::opt::Instruction_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<const_spvtools::opt::Instruction_*>,_std::equal_to<const_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_spvtools::opt::Instruction_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
       ::end(&this->inst_to_used_ids_);
  bVar1 = std::__detail::operator!=
                    (&local_20,
                     (_Node_iterator_base<std::pair<const_spvtools::opt::Instruction_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_false>
                      *)&users_begin);
  if (bVar1) {
    EraseUseRecordsOfOperandIds
              (this,(Instruction *)
                    iter.
                    super__Node_iterator_base<std::pair<const_spvtools::opt::Instruction_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_false>
                    ._M_cur);
    uVar2 = opt::Instruction::result_id
                      ((Instruction *)
                       iter.
                       super__Node_iterator_base<std::pair<const_spvtools::opt::Instruction_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_false>
                       ._M_cur);
    if (uVar2 != 0) {
      __first = UsersBegin(this,(Instruction *)
                                iter.
                                super__Node_iterator_base<std::pair<const_spvtools::opt::Instruction_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_false>
                                ._M_cur);
      new_end._M_node =
           (_Base_ptr)
           std::
           set<spvtools::opt::analysis::UserEntry,_spvtools::opt::analysis::UserEntryLess,_std::allocator<spvtools::opt::analysis::UserEntry>_>
           ::end(&this->id_to_users_);
      local_40 = __first;
      while (bVar1 = UsersNotEnd(this,&local_40,&new_end,
                                 (Instruction *)
                                 iter.
                                 super__Node_iterator_base<std::pair<const_spvtools::opt::Instruction_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_false>
                                 ._M_cur), bVar1) {
        std::_Rb_tree_const_iterator<spvtools::opt::analysis::UserEntry>::operator++(&local_40);
      }
      local_50 = local_40._M_node;
      local_48 = __first._M_node;
      local_58 = (_Base_ptr)
                 std::
                 set<spvtools::opt::analysis::UserEntry,spvtools::opt::analysis::UserEntryLess,std::allocator<spvtools::opt::analysis::UserEntry>>
                 ::erase_abi_cxx11_((set<spvtools::opt::analysis::UserEntry,spvtools::opt::analysis::UserEntryLess,std::allocator<spvtools::opt::analysis::UserEntry>>
                                     *)&this->id_to_users_,__first,local_40);
      local_5c = opt::Instruction::result_id
                           ((Instruction *)
                            iter.
                            super__Node_iterator_base<std::pair<const_spvtools::opt::Instruction_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_false>
                            ._M_cur);
      std::
      unordered_map<unsigned_int,_spvtools::opt::Instruction_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>
      ::erase(&this->id_to_def_,&local_5c);
    }
  }
  return;
}

Assistant:

void DefUseManager::ClearInst(Instruction* inst) {
  auto iter = inst_to_used_ids_.find(inst);
  if (iter != inst_to_used_ids_.end()) {
    EraseUseRecordsOfOperandIds(inst);
    if (inst->result_id() != 0) {
      // Remove all uses of this inst.
      auto users_begin = UsersBegin(inst);
      auto end = id_to_users_.end();
      auto new_end = users_begin;
      for (; UsersNotEnd(new_end, end, inst); ++new_end) {
      }
      id_to_users_.erase(users_begin, new_end);
      id_to_def_.erase(inst->result_id());
    }
  }
}